

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::section_data(ostream *out,section *sec)

{
  ulong uVar1;
  section *psVar2;
  _Setfill<char> _Var3;
  int iVar4;
  _Setw _Var5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long *puVar7;
  void *pvVar8;
  unsigned_long local_68;
  ulong local_60;
  Elf_Xword i;
  char *pdata;
  string local_40 [36];
  fmtflags local_1c;
  section *psStack_18;
  fmtflags original_flags;
  section *sec_local;
  ostream *out_local;
  
  psStack_18 = sec;
  sec_local = (section *)out;
  local_1c = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  psVar2 = sec_local;
  (*psStack_18->_vptr_section[3])();
  poVar6 = std::operator<<((ostream *)psVar2,local_40);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  iVar4 = (*psStack_18->_vptr_section[0x18])();
  i = CONCAT44(extraout_var,iVar4);
  if (i != 0) {
    local_60 = 0;
    while( true ) {
      uVar1 = local_60;
      iVar4 = (*psStack_18->_vptr_section[0x13])();
      local_68 = CONCAT44(extraout_var_00,iVar4);
      puVar7 = std::min<unsigned_long>(&local_68,&MAX_DATA_ENTRIES);
      if (*puVar7 <= uVar1) break;
      if ((local_60 & 0xf) == 0) {
        poVar6 = std::operator<<((ostream *)sec_local,"[");
        poVar6 = std::operator<<(poVar6,"0x");
        _Var5 = std::setw(8);
        poVar6 = std::operator<<(poVar6,_Var5);
        _Var3 = std::setfill<char>('0');
        poVar6 = std::operator<<(poVar6,_Var3._M_c);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,std::hex);
        pvVar8 = (void *)std::ostream::operator<<(pvVar8,std::right);
        poVar6 = (ostream *)std::ostream::operator<<(pvVar8,local_60);
        std::operator<<(poVar6,"]");
      }
      poVar6 = std::operator<<((ostream *)sec_local," ");
      poVar6 = std::operator<<(poVar6,"0x");
      _Var5 = std::setw(2);
      poVar6 = std::operator<<(poVar6,_Var5);
      _Var3 = std::setfill<char>('0');
      poVar6 = std::operator<<(poVar6,_Var3._M_c);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,std::hex);
      pvVar8 = (void *)std::ostream::operator<<(pvVar8,std::right);
      std::ostream::operator<<(pvVar8,(uint)*(byte *)(i + local_60));
      if ((local_60 & 0xf) == 0xf) {
        std::ostream::operator<<(sec_local,std::endl<char,std::char_traits<char>>);
      }
      local_60 = local_60 + 1;
    }
    if ((local_60 & 0xf) != 0) {
      std::ostream::operator<<(sec_local,std::endl<char,std::char_traits<char>>);
    }
    std::ios_base::flags
              ((ios_base *)(sec_local->_vptr_section[-3] + (long)&sec_local->_vptr_section),local_1c
              );
  }
  return;
}

Assistant:

static void section_data( std::ostream& out, const section* sec )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        out << sec->get_name() << std::endl;
        const char* pdata = sec->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i;
            for ( i = 0; i < std::min( sec->get_size(), MAX_DATA_ENTRIES );
                  ++i ) {
                if ( i % 16 == 0 ) {
                    out << "[" << DUMP_HEX0x_FORMAT( 8 ) << i << "]";
                }

                out << " " << DUMP_HEX0x_FORMAT( 2 )
                    << ( pdata[i] & 0x000000FF );

                if ( i % 16 == 15 ) {
                    out << std::endl;
                }
            }
            if ( i % 16 != 0 ) {
                out << std::endl;
            }

            out.flags( original_flags );
        }

        return;
    }